

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O2

string * __thiscall
Logger::formatError_abi_cxx11_
          (string *__return_storage_ptr__,Logger *this,ErrorType type,char *text)

{
  size_t sVar1;
  string *fmt;
  undefined4 in_register_00000014;
  char **in_R8;
  string position;
  undefined1 local_60 [8];
  char *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string local_38;
  
  local_60 = (undefined1  [8])CONCAT44(in_register_00000014,type);
  local_58 = local_50._M_local_buf + 8;
  local_50._M_allocated_capacity = 0;
  local_50._M_local_buf[8] = '\0';
  if (!Global.memoryMode) {
    sVar1 = FileList::size(&Global.fileList);
    if (sVar1 != 0) {
      fmt = FileList::relativeString_abi_cxx11_(&Global.fileList,Global.FileInfo.FileNum);
      tinyformat::format<std::__cxx11::string,int>
                (&local_38,(tinyformat *)"%s(%d) ",(char *)fmt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Global.FileInfo.LineNumber,(int *)in_R8);
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  if ((uint)this < 4) {
    tinyformat::format<std::__cxx11::string,char_const*>
              (__return_storage_ptr__,
               (tinyformat *)
               (&DAT_001778e4 + *(int *)(&DAT_001778e4 + ((ulong)this & 0xffffffff) * 4)),
               (char *)&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,in_R8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_38);
  }
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string Logger::formatError(ErrorType type, const char* text)
{
	std::string position;

	if (!Global.memoryMode && Global.fileList.size() > 0)
	{
		const auto& fileName = Global.fileList.relativeString(Global.FileInfo.FileNum);
		position = tfm::format("%s(%d) ", fileName, Global.FileInfo.LineNumber);
	}

	switch (type)
	{
	case Warning:
		return tfm::format("%swarning: %s",position,text);
	case Error:
		return tfm::format("%serror: %s",position,text);
	case FatalError:
		return tfm::format("%sfatal error: %s",position,text);
	case Notice:
		return tfm::format("%snotice: %s",position,text);
	}

	return "";
}